

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O0

void __thiscall
wasm::ModuleReader::readBinaryData
          (ModuleReader *this,vector<char,_std::allocator<char>_> *input,Module *wasm,
          string *sourceMapFilename)

{
  long lVar1;
  BinaryOption binary;
  void *__buf;
  uint __fd;
  undefined1 local_458 [8];
  WasmBinaryReader parser;
  vector<char,_std::allocator<char>_> local_58;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> sourceMapBuffer;
  string *sourceMapFilename_local;
  Module *wasm_local;
  vector<char,_std::allocator<char>_> *input_local;
  ModuleReader *this_local;
  string *psVar2;
  
  psVar2 = sourceMapFilename;
  sourceMapBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = sourceMapFilename
  ;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  binary = (BinaryOption)psVar2;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    read_file<std::vector<char,std::allocator<char>>>
              (&local_58,(wasm *)sourceMapFilename,(string *)0x1,binary);
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)local_40,&local_58);
    std::vector<char,_std::allocator<char>_>::~vector(&local_58);
  }
  WasmBinaryReader::WasmBinaryReader
            ((WasmBinaryReader *)local_458,wasm,(FeatureSet)(wasm->features).features,input,
             (vector<char,_std::allocator<char>_> *)local_40);
  WasmBinaryReader::setDebugInfo((WasmBinaryReader *)local_458,(bool)((byte)*this & 1));
  WasmBinaryReader::setDWARF((WasmBinaryReader *)local_458,(bool)((byte)this[1] & 1));
  __fd = (byte)this[8] & 1;
  WasmBinaryReader::setSkipFunctionBodies((WasmBinaryReader *)local_458,SUB41(__fd,0));
  WasmBinaryReader::read((WasmBinaryReader *)local_458,__fd,__buf,(size_t)input);
  WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)local_458);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return;
}

Assistant:

void ModuleReader::readBinaryData(std::vector<char>& input,
                                  Module& wasm,
                                  std::string sourceMapFilename) {
  std::vector<char> sourceMapBuffer;
  if (sourceMapFilename.size()) {
    sourceMapBuffer =
      read_file<std::vector<char>>(sourceMapFilename, Flags::Text);
  }
  // Assume that the wasm has had its initial features applied, and use those
  // while parsing.
  WasmBinaryReader parser(wasm, wasm.features, input, sourceMapBuffer);
  parser.setDebugInfo(debugInfo);
  parser.setDWARF(DWARF);
  parser.setSkipFunctionBodies(skipFunctionBodies);
  parser.read();
}